

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O2

void DivisionHelper<unsigned_long,_signed_char,_1>::
     DivideThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
               (unsigned_long *t,char *u,unsigned_long *result)

{
  byte t_00;
  uint32_t uVar1;
  ulong uVar2;
  
  t_00 = *u;
  if ((ulong)t_00 == 0) {
    safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnDivZero();
  }
  if (*t != 0) {
    if ('\0' < (char)t_00) {
      uVar2 = *t / (ulong)t_00;
      goto LAB_001187b2;
    }
    uVar1 = AbsValueHelper<signed_char,_0>::Abs(t_00);
    if ((ulong)uVar1 <= *t) {
      safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
    }
  }
  uVar2 = 0;
LAB_001187b2:
  *result = uVar2;
  return;
}

Assistant:

SAFEINT_CONSTEXPR14 static void DivideThrow( const T& t, const U& u, T& result ) SAFEINT_CPP_THROW
    {

        if( u == 0 )
            E::SafeIntOnDivZero();

        if( t == 0 )
        {
            result = 0;
            return;
        }

        if( u > 0 )
        {
            result = (T)( t/u );
            return;
        }

        // it is always an error to try and divide an unsigned number by a negative signed number
        // unless u is bigger than t
        if( AbsValueHelper< U, GetAbsMethod< U >::method >::Abs( u ) > t )
        {
            result = 0;
            return;
        }

        E::SafeIntOnOverflow();
    }